

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O2

void __thiscall
leveldb::FaultInjectionTest::NoWriteTestReopenWithFault
          (FaultInjectionTest *this,ResetMethod reset_method)

{
  undefined1 auStack_1b8 [424];
  
  CloseDB(this);
  ResetDBState(this,reset_method);
  test::Tester::Tester
            ((Tester *)(auStack_1b8 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/fault_injection_test.cc"
             ,0x1fe);
  OpenDB((FaultInjectionTest *)auStack_1b8);
  test::Tester::IsOk((Tester *)(auStack_1b8 + 8),(Status *)auStack_1b8);
  Status::~Status((Status *)auStack_1b8);
  test::Tester::~Tester((Tester *)(auStack_1b8 + 8));
  return;
}

Assistant:

void NoWriteTestReopenWithFault(ResetMethod reset_method) {
    CloseDB();
    ResetDBState(reset_method);
    ASSERT_OK(OpenDB());
  }